

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_2,_2> * gl4cts::Math::transpose<double,2,2>(Matrix<double,_2,_2> *matrix)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Matrix<double,_2,_2> *res;
  Matrix<double,_2,_2> *result;
  
  (res->m_data).m_data[0].m_data[0] = (matrix->m_data).m_data[0].m_data[0];
  auVar1 = *(undefined1 (*) [16])((matrix->m_data).m_data[0].m_data + 1);
  auVar2._8_4_ = auVar1._0_4_;
  auVar2._0_8_ = auVar1._8_8_;
  auVar2._12_4_ = auVar1._4_4_;
  *(undefined1 (*) [16])((res->m_data).m_data[0].m_data + 1) = auVar2;
  (res->m_data).m_data[1].m_data[1] = (matrix->m_data).m_data[1].m_data[1];
  return res;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}